

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  undefined1 *puVar1;
  Nf_Mat_t (*paNVar2) [2];
  Nf_Obj_t *pNVar3;
  Vec_Flt_t *pVVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Nf_Man_t *p;
  Scl_Con_t *pSVar7;
  Vec_Int_t *pVVar8;
  char *pTitle;
  long lVar9;
  long lVar10;
  
  if (pGia->pSibls != (int *)0x0) {
    pPars->fCoarsen = 0;
  }
  pGVar6 = pGia;
  if (pPars->fCoarsen != 0) {
    pGVar6 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p = Nf_StoCreate(pGVar6,pPars);
  if (p == (Nf_Man_t *)0x0) {
    pGVar6 = (Gia_Man_t *)0x0;
  }
  else {
    if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
      printf("Initial ");
      Gia_ManPrintMuxStats(pGia);
      putchar(10);
      printf("Derived ");
      Gia_ManPrintMuxStats(pGVar6);
      putchar(10);
    }
    Nf_ManPrintInit(p);
    Nf_ManComputeCuts(p);
    Nf_ManPrintQuit(p);
    pSVar7 = Scl_ConReadMan();
    pGVar6 = p->pGia;
    pVVar8 = pGVar6->vCis;
    if (pSVar7 == (Scl_Con_t *)0x0) {
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          iVar5 = pVVar8->pArray[lVar10];
          lVar9 = (long)iVar5;
          if ((lVar9 < 0) || (pGVar6->nObjs <= iVar5)) goto LAB_00782b20;
          if (iVar5 == 0) break;
          pVVar4 = pGVar6->vInArrs;
          if (pVVar4 == (Vec_Flt_t *)0x0) {
            iVar5 = 0;
          }
          else {
            if (pVVar4->nSize <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
            }
            iVar5 = (int)(pVVar4->pArray[lVar10] * 1000.0);
          }
          pNVar3 = p->pNfObjs;
          pNVar3[lVar9].M[1][1].D = iVar5;
          pNVar3[lVar9].M[1][0].D = iVar5;
          pNVar3[lVar9].M[0][1].D = iVar5;
          pNVar3[lVar9].M[0][0].D = iVar5;
          puVar1 = &pNVar3[lVar9].M[1][0].field_0x3;
          *puVar1 = *puVar1 | 0x40;
          pNVar3[lVar9].M[1][0].D = p->InvDelayI + iVar5;
          pNVar3[lVar9].M[1][0].F = p->InvAreaF;
          puVar1 = &pNVar3[lVar9].M[1][1].field_0x3;
          *puVar1 = *puVar1 | 0x40;
          pNVar3[lVar9].M[1][1].D = iVar5 + p->InvDelayI;
          pNVar3[lVar9].M[1][1].F = p->InvAreaF;
          *(uint *)p->pNfObjs[lVar9].M[0] = *(uint *)p->pNfObjs[lVar9].M[0] | 0x80000000;
          paNVar2 = p->pNfObjs[lVar9].M + 1;
          *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
          lVar10 = lVar10 + 1;
          pGVar6 = p->pGia;
          pVVar8 = pGVar6->vCis;
        } while (lVar10 < pVVar8->nSize);
      }
    }
    else if (0 < pVVar8->nSize) {
      lVar10 = 0;
      do {
        iVar5 = pVVar8->pArray[lVar10];
        lVar9 = (long)iVar5;
        if ((lVar9 < 0) || (pGVar6->nObjs <= iVar5)) {
LAB_00782b20:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar5 == 0) break;
        pSVar7 = Scl_ConReadMan();
        if ((pSVar7->vInArrs).nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (pSVar7->vInArrs).pArray[lVar10];
        pNVar3 = p->pNfObjs;
        pNVar3[lVar9].M[1][1].D = iVar5;
        pNVar3[lVar9].M[1][0].D = iVar5;
        pNVar3[lVar9].M[0][1].D = iVar5;
        pNVar3[lVar9].M[0][0].D = iVar5;
        puVar1 = &pNVar3[lVar9].M[1][0].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar9].M[1][0].D = p->InvDelayI + iVar5;
        pNVar3[lVar9].M[1][0].F = p->InvAreaF;
        puVar1 = &pNVar3[lVar9].M[1][1].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar9].M[1][1].D = iVar5 + p->InvDelayI;
        pNVar3[lVar9].M[1][1].F = p->InvAreaF;
        *(uint *)p->pNfObjs[lVar9].M[0] = *(uint *)p->pNfObjs[lVar9].M[0] | 0x80000000;
        paNVar2 = p->pNfObjs[lVar9].M + 1;
        *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
        lVar10 = lVar10 + 1;
        pGVar6 = p->pGia;
        pVVar8 = pGVar6->vCis;
      } while (lVar10 < pVVar8->nSize);
    }
    p->Iter = 0;
    if (0 < p->pPars->nRounds) {
      do {
        Nf_ManComputeMapping(p);
        Nf_ManSetMapRefs(p);
        pTitle = "Area ";
        if (p->Iter == 0) {
          pTitle = "Delay";
        }
        Nf_ManPrintStats(p,pTitle);
        iVar5 = p->Iter + 1;
        p->Iter = iVar5;
      } while (iVar5 < p->pPars->nRounds);
    }
    p->fUseEla = 1;
    if (p->Iter < pPars->nRoundsEla + p->pPars->nRounds) {
      do {
        Nf_ManComputeMappingEla(p);
        Nf_ManUpdateStats(p);
        Nf_ManPrintStats(p,"Ela  ");
        iVar5 = p->Iter + 1;
        p->Iter = iVar5;
      } while (iVar5 < pPars->nRoundsEla + p->pPars->nRounds);
    }
    Nf_ManFixPoDrivers(p);
    pGVar6 = Nf_ManDeriveMapping(p);
    Nf_StoDelete(p);
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
    if ( p == NULL )
        return NULL;
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
//            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Vec_FltEntry(p->pGia->vInArrs, i) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    Nf_ManFixPoDrivers( p );
    pNew = Nf_ManDeriveMapping( p );
/*
    if ( pPars->fAreaOnly )
    {
        int Sbm_ManTestSat( void * pMan );
        Sbm_ManTestSat( p );
    }
*/
    Nf_StoDelete( p );
    return pNew;
}